

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Array_encodeBinary(void *src,size_t length,UA_DataType *type)

{
  UA_Int32 local_2c;
  UA_StatusCode retval;
  UA_Int32 signed_length;
  UA_DataType *type_local;
  size_t length_local;
  void *src_local;
  
  local_2c = -1;
  if (length < 0x80000000) {
    if (length == 0) {
      if (src == (void *)0x1) {
        local_2c = 0;
      }
    }
    else {
      local_2c = (UA_Int32)length;
    }
    _retval = type;
    type_local = (UA_DataType *)length;
    length_local = (size_t)src;
    src_local._4_4_ = Int32_encodeBinary(&local_2c);
    if ((src_local._4_4_ == 0) && (type_local != (UA_DataType *)0x0)) {
      if (((byte)_retval->field_0x25 >> 2 & 1) == 0) {
        src_local._4_4_ = Array_encodeBinaryComplex(length_local,(size_t)type_local,_retval);
      }
      else {
        src_local._4_4_ =
             Array_encodeBinaryOverlayable(length_local,(size_t)type_local,(ulong)_retval->memSize);
      }
    }
  }
  else {
    src_local._4_4_ = 0x80020000;
  }
  return src_local._4_4_;
}

Assistant:

static UA_StatusCode
Array_encodeBinary(const void *src, size_t length, const UA_DataType *type) {
    /* Check and convert the array length to int32 */
    UA_Int32 signed_length = -1;
    if(length > UA_INT32_MAX)
        return UA_STATUSCODE_BADINTERNALERROR;
    if(length > 0)
        signed_length = (UA_Int32)length;
    else if(src == UA_EMPTY_ARRAY_SENTINEL)
        signed_length = 0;

    /* Encode the array length */
    UA_StatusCode retval = Int32_encodeBinary(&signed_length);
    if(retval != UA_STATUSCODE_GOOD || length == 0)
        return retval;

    /* Encode the content */
    if(!type->overlayable)
        return Array_encodeBinaryComplex((uintptr_t)src, length, type);
    return Array_encodeBinaryOverlayable((uintptr_t)src, length, type->memSize);
}